

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQuatSlerp.cpp
# Opt level: O2

void anon_unknown.dwarf_b1d00::compareQuats(Quatf *q1,Quatf *q2,float e)

{
  float fVar1;
  float fVar2;
  uint __line;
  char *__assertion;
  
  fVar1 = (q1->v).x;
  fVar2 = (q2->v).x;
  if (e < (float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                 (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1))) {
    __assertion = "equalWithAbsError (q1.v.x, q2.v.x, e)";
    __line = 0x37;
  }
  else {
    fVar1 = (q1->v).y;
    fVar2 = (q2->v).y;
    if (e < (float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                   (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1))) {
      __assertion = "equalWithAbsError (q1.v.y, q2.v.y, e)";
      __line = 0x38;
    }
    else {
      fVar1 = (q1->v).z;
      fVar2 = (q2->v).z;
      if (e < (float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                     (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1))) {
        __assertion = "equalWithAbsError (q1.v.z, q2.v.z, e)";
        __line = 0x39;
      }
      else {
        fVar1 = q1->r;
        fVar2 = q2->r;
        if ((float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                   (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1)) <= e) {
          return;
        }
        __assertion = "equalWithAbsError (q1.r, q2.r, e)";
        __line = 0x3a;
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testQuatSlerp.cpp"
                ,__line,
                "void (anonymous namespace)::compareQuats(const Quatf &, const Quatf &, float)");
}

Assistant:

void
compareQuats (const Quatf &q1, const Quatf &q2, float e)
{
    assert (equalWithAbsError (q1.v.x, q2.v.x, e));
    assert (equalWithAbsError (q1.v.y, q2.v.y, e));
    assert (equalWithAbsError (q1.v.z, q2.v.z, e));
    assert (equalWithAbsError (q1.r,   q2.r,   e));
}